

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMath.cpp
# Opt level: O0

VRMatrix4 * MinVR::VRMatrix4::scale(VRVector3 *v)

{
  VRVector3 *in_RSI;
  VRMatrix4 *in_RDI;
  float r2c3;
  float r2c4;
  float in_stack_00000010;
  float in_stack_00000018;
  float in_stack_00000020;
  float in_stack_00000028;
  float in_stack_00000030;
  float in_stack_00000038;
  float in_stack_00000040;
  float in_stack_00000048;
  VRMatrix4 *pVVar1;
  
  pVVar1 = in_RDI;
  r2c3 = VRVector3::operator[](in_RSI,0);
  r2c4 = VRVector3::operator[](in_RSI,1);
  VRVector3::operator[](in_RSI,2);
  fromRowMajorElements
            ((float)((ulong)pVVar1 >> 0x20),SUB84(pVVar1,0),(float)((ulong)in_RSI >> 0x20),
             SUB84(in_RSI,0),(float)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0),r2c3,r2c4,
             in_stack_00000010,in_stack_00000018,in_stack_00000020,in_stack_00000028,
             in_stack_00000030,in_stack_00000038,in_stack_00000040,in_stack_00000048);
  return in_RDI;
}

Assistant:

VRMatrix4 VRMatrix4::scale(const VRVector3& v) {
    return VRMatrix4::fromRowMajorElements(v[0], 0, 0, 0,
                                           0, v[1], 0, 0,
                                           0, 0, v[2], 0,
                                           0, 0, 0, 1);
}